

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_rectfill_quint24(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color
                        )

{
  Format FVar1;
  uchar *puVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QRasterBuffer *in_RDI;
  QRgba64 *in_R9;
  long in_FS_OFFSET;
  QPixelLayout *layout;
  quint32 c32;
  quint24 c24;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  uint local_14;
  undefined2 local_10;
  undefined1 local_e;
  undefined2 local_c;
  undefined1 local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  FVar1 = in_RDI->format;
  local_14 = QRgba64::toArgb32(in_R9);
  local_a = 0xaa;
  local_c = 0xaaaa;
  (*qPixelLayouts[FVar1].storeFromARGB32PM)
            ((uchar *)&local_c,&local_14,0,1,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
  puVar2 = QRasterBuffer::buffer(in_RDI);
  local_e = local_a;
  local_10 = local_c;
  QRasterBuffer::bytesPerLine(in_RDI);
  qt_rectfill<quint24>
            ((quint24 *)CONCAT44(in_EDX,in_ESI),(quint24)SUB83((ulong)in_R9 >> 0x28,0),
             (int)((ulong)puVar2 >> 0x20),(int)puVar2,in_stack_ffffffffffffffa4,
             in_stack_ffffffffffffffa0,(qsizetype)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_rectfill_quint24(QRasterBuffer *rasterBuffer,
                                int x, int y, int width, int height,
                                const QRgba64 &color)
{
    const QPixelLayout &layout = qPixelLayouts[rasterBuffer->format];
    quint32 c32 = color.toArgb32();
    quint24 c24;
    layout.storeFromARGB32PM(reinterpret_cast<uchar *>(&c24), &c32, 0, 1, nullptr, nullptr);
    qt_rectfill<quint24>(reinterpret_cast<quint24 *>(rasterBuffer->buffer()),
                         c24, x, y, width, height, rasterBuffer->bytesPerLine());
}